

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O1

FieldBase * __thiscall FIX::FieldMap::reverse_find(FieldMap *this,int tag)

{
  FieldNotFound *this_00;
  const_reverse_iterator field;
  pointer local_58;
  string local_50;
  pointer local_30;
  
  local_30 = (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p =
       (pointer)(this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>,__gnu_cxx::__ops::_Iter_pred<FIX::FieldMap::finder>>
            (&local_58,&local_50,&local_30,tag);
  if (local_58 !=
      (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
      super__Vector_impl_data._M_start) {
    return local_58 + -1;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  FieldNotFound::FieldNotFound(this_00,tag,&local_50);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,FIX::Exception::~Exception);
}

Assistant:

const FieldBase &reverse_find(int tag) const {
    Fields::const_reverse_iterator field = std::find_if(m_fields.rbegin(), m_fields.rend(), finder(tag));
    if (field == m_fields.rend()) {
      throw FieldNotFound(tag);
    }

    return *field;
  }